

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::suppresssteinerpoints(tetgenmesh *this)

{
  point pdVar1;
  long lVar2;
  double dVar3;
  verttype vVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  uint local_94;
  int local_90;
  int j;
  int nt;
  int ivcount;
  int count;
  int smtcount;
  double ori;
  point *ppt;
  triface *parytet;
  optparameters opm;
  int i;
  int remcount;
  int suppcount;
  int bak_fliplinklevel;
  point *parypt;
  point rempt;
  tetgenmesh *this_local;
  
  if (this->b->quiet == 0) {
    printf("Suppressing Steiner points ...\n");
  }
  iVar6 = this->b->fliplinklevel;
  this->b->fliplinklevel = 100000;
  i = 0;
  opm.smthiter = 0;
  for (opm.maxiter = 0; (long)opm.maxiter < this->subvertstack->objects;
      opm.maxiter = opm.maxiter + 1) {
    pdVar1 = *(point *)(this->subvertstack->toparray
                        [opm.maxiter >> ((byte)this->subvertstack->log2objectsperblock & 0x1f)] +
                       (opm.maxiter & this->subvertstack->objectsperblockmark) *
                       this->subvertstack->objectbytes);
    vVar4 = pointtype(this,pdVar1);
    if ((vVar4 != UNUSEDVERTEX) &&
       (((vVar4 = pointtype(this,pdVar1), vVar4 == FREESEGVERTEX ||
         (vVar4 = pointtype(this,pdVar1), vVar4 == FREEFACETVERTEX)) &&
        (iVar5 = suppressbdrysteinerpoint(this,pdVar1), iVar5 != 0)))) {
      i = i + 1;
    }
  }
  if ((0 < i) && (this->b->verbose != 0)) {
    printf("  Suppressed %d boundary Steiner points.\n",(ulong)(uint)i);
  }
  if (0 < this->b->supsteiner_level) {
    for (opm.maxiter = 0; (long)opm.maxiter < this->subvertstack->objects;
        opm.maxiter = opm.maxiter + 1) {
      pdVar1 = *(point *)(this->subvertstack->toparray
                          [opm.maxiter >> ((byte)this->subvertstack->log2objectsperblock & 0x1f)] +
                         (opm.maxiter & this->subvertstack->objectsperblockmark) *
                         this->subvertstack->objectbytes);
      vVar4 = pointtype(this,pdVar1);
      if (((vVar4 != UNUSEDVERTEX) && (vVar4 = pointtype(this,pdVar1), vVar4 == FREEVOLVERTEX)) &&
         (iVar5 = removevertexbyflips(this,pdVar1), iVar5 != 0)) {
        opm.smthiter = opm.smthiter + 1;
      }
    }
  }
  if ((0 < opm.smthiter) && (this->b->verbose != 0)) {
    printf("  Removed %d interior Steiner points.\n",(ulong)(uint)opm.smthiter);
  }
  this->b->fliplinklevel = iVar6;
  if (1 < this->b->supsteiner_level) {
    optparameters::optparameters((optparameters *)&parytet);
    parytet._0_4_ = 1;
    opm.imprval._0_4_ = 0x14;
    opm.numofsearchdirs = -0x2d0e5604;
    opm._36_4_ = 0x3f50624d;
    opm.searchstep._0_4_ = 0x1e;
    ivcount = 0;
    while( true ) {
      local_90 = 0;
      do {
        nt = 0;
        j = 0;
        for (opm.maxiter = 0; (long)opm.maxiter < this->subvertstack->objects;
            opm.maxiter = opm.maxiter + 1) {
          pdVar1 = *(point *)(this->subvertstack->toparray
                              [opm.maxiter >> ((byte)this->subvertstack->log2objectsperblock & 0x1f)
                              ] + (opm.maxiter & this->subvertstack->objectsperblockmark) *
                                  this->subvertstack->objectbytes);
          vVar4 = pointtype(this,pdVar1);
          if (vVar4 == FREEVOLVERTEX) {
            getvertexstar(this,1,pdVar1,this->cavetetlist,(arraypool *)0x0,(arraypool *)0x0);
            for (local_94 = 0; (long)(int)local_94 < this->cavetetlist->objects;
                local_94 = local_94 + 1) {
              lVar2 = *(long *)(this->cavetetlist->toparray
                                [(int)local_94 >>
                                 ((byte)this->cavetetlist->log2objectsperblock & 0x1f)] +
                               (int)((local_94 & this->cavetetlist->objectsperblockmark) *
                                    this->cavetetlist->objectbytes));
              dVar7 = orient3dfast(this,*(double **)(lVar2 + 0x28),*(double **)(lVar2 + 0x20),
                                   *(double **)(lVar2 + 0x30),*(double **)(lVar2 + 0x38));
              dVar3 = dVar7;
              if ((local_94 != 0) && (dVar3 = (double)opm._8_8_, dVar7 < (double)opm._8_8_)) {
                dVar3 = dVar7;
              }
              opm._8_8_ = dVar3;
            }
            iVar6 = smoothpoint(this,pdVar1,this->cavetetlist,1,(optparameters *)&parytet);
            if (iVar6 != 0) {
              nt = nt + 1;
            }
            if (opm.initval <= 0.0) {
              j = j + 1;
            }
            arraypool::restart(this->cavetetlist);
          }
        }
        ivcount = nt + ivcount;
      } while ((nt != 0) && (local_90 = local_90 + 1, local_90 < 3));
      if ((j < 1) || (opm.searchstep._0_4_ < 1)) break;
      opm.imprval._0_4_ = 0x1e;
      opm.numofsearchdirs = -0x14e3bcd3;
      opm._36_4_ = 0x3f1a36e2;
      opm.searchstep._0_4_ = -1;
    }
    if (0 < j) {
      printf("BUG Report!  The mesh contain inverted elements.\n");
    }
    if ((this->b->verbose != 0) && (0 < ivcount)) {
      printf("  Smoothed %d Steiner points.\n",(ulong)(uint)ivcount);
    }
  }
  arraypool::restart(this->subvertstack);
  return 1;
}

Assistant:

int tetgenmesh::suppresssteinerpoints()
{

  if (!b->quiet) {
    printf("Suppressing Steiner points ...\n");
  }

  point rempt, *parypt;

  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = 100000; // Unlimited flip level.
  int suppcount = 0, remcount = 0;
  int i;

  // Try to suppress boundary Steiner points.
  for (i = 0; i < subvertstack->objects; i++) {
    parypt = (point *) fastlookup(subvertstack, i);
    rempt = *parypt;
    if (pointtype(rempt) != UNUSEDVERTEX) {
      if ((pointtype(rempt) == FREESEGVERTEX) || 
          (pointtype(rempt) == FREEFACETVERTEX)) {
        if (suppressbdrysteinerpoint(rempt)) {
          suppcount++;
        }
      }
    }
  } // i

  if (suppcount > 0) {
    if (b->verbose) {
      printf("  Suppressed %d boundary Steiner points.\n", suppcount);
    }
  }

  if (b->supsteiner_level > 0) { // -Y/1
    for (i = 0; i < subvertstack->objects; i++) {
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (pointtype(rempt) != UNUSEDVERTEX) {
        if (pointtype(rempt) == FREEVOLVERTEX) {
          if (removevertexbyflips(rempt)) {
            remcount++;
          }
        }
      }
    }
  }

  if (remcount > 0) {
    if (b->verbose) {
      printf("  Removed %d interior Steiner points.\n", remcount);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;

  if (b->supsteiner_level > 1) { // -Y/2
    // Smooth interior Steiner points.
    optparameters opm;
    triface *parytet;
    point *ppt;
    REAL ori;
    int smtcount, count, ivcount;
    int nt, j;

    // Point smooth options.
    opm.max_min_volume = 1;
    opm.numofsearchdirs = 20;
    opm.searchstep = 0.001;
    opm.maxiter = 30; // Limit the maximum iterations.

    smtcount = 0;

    do {

      nt = 0;

      while (1) {
        count = 0;
        ivcount = 0; // Clear the inverted count.

        for (i = 0; i < subvertstack->objects; i++) {
          parypt = (point *) fastlookup(subvertstack, i);
          rempt = *parypt;
          if (pointtype(rempt) == FREEVOLVERTEX) {
            getvertexstar(1, rempt, cavetetlist, NULL, NULL);
            // Calculate the initial smallest volume (maybe zero or negative).
            for (j = 0; j < cavetetlist->objects; j++) {
              parytet = (triface *) fastlookup(cavetetlist, j);
              ppt = (point *) &(parytet->tet[4]);
              ori = orient3dfast(ppt[1], ppt[0], ppt[2], ppt[3]);
              if (j == 0) {
                opm.initval = ori;
              } else {
                if (opm.initval > ori) opm.initval = ori; 
              }
            }
            if (smoothpoint(rempt, cavetetlist, 1, &opm)) {
              count++;
            }
            if (opm.imprval <= 0.0) {
              ivcount++; // The mesh contains inverted elements.
            }
            cavetetlist->restart();
          }
        } // i

        smtcount += count;

        if (count == 0) {
          // No point has been smoothed.
          break;
        }

        nt++;
        if (nt > 2) {
          break; // Already three iterations.
        }
      } // while

      if (ivcount > 0) {
        // There are inverted elements!
        if (opm.maxiter > 0) {
          // Set unlimited smoothing steps. Try again.
          opm.numofsearchdirs = 30;
          opm.searchstep = 0.0001;
          opm.maxiter = -1;
          continue;
        }
      }

      break;
    } while (1); // Additional loop for (ivcount > 0)

    if (ivcount > 0) {
      printf("BUG Report!  The mesh contain inverted elements.\n");
    }

    if (b->verbose) {
      if (smtcount > 0) {
        printf("  Smoothed %d Steiner points.\n", smtcount); 
      }
    }
  } // -Y2

  subvertstack->restart();

  return 1;
}